

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void glcts::fillImage<float,1u>
               (GLsizei image_width,GLsizei image_height,float *pixel_components,float *out_data)

{
  bool bVar1;
  int local_34;
  GLuint component;
  GLsizei x;
  GLuint line_offset;
  GLsizei y;
  GLuint n_components_per_line;
  GLuint n_components_per_pixel;
  float *out_data_local;
  float *pixel_components_local;
  GLsizei image_height_local;
  GLsizei image_width_local;
  
  for (x = 0; x < image_height; x = x + 1) {
    for (local_34 = 0; local_34 < image_width; local_34 = local_34 + 1) {
      bVar1 = false;
      while (!bVar1) {
        out_data[(uint)(x * image_width + local_34)] = *pixel_components;
        bVar1 = true;
      }
    }
  }
  return;
}

Assistant:

void fillImage(glw::GLsizei image_width, glw::GLsizei image_height, const T* pixel_components, T* out_data)
{
	const glw::GLuint n_components_per_pixel = N_Components;
	const glw::GLuint n_components_per_line  = n_components_per_pixel * image_width;

	for (glw::GLsizei y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * n_components_per_line;

		for (glw::GLsizei x = 0; x < image_width; ++x)
		{
			for (glw::GLuint component = 0; component < n_components_per_pixel; ++component)
			{
				out_data[line_offset + x * n_components_per_pixel + component] = pixel_components[component];
			}
		}
	}
}